

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O3

void __thiscall
spvutils::
HexFloat<spvutils::FloatProxy<float>,spvutils::HexFloatTraits<spvutils::FloatProxy<float>>>::
castTo<spvutils::HexFloat<spvutils::FloatProxy<spvutils::Float16>,spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>>>>
          (HexFloat<spvutils::FloatProxy<float>,spvutils::HexFloatTraits<spvutils::FloatProxy<float>>>
           *this,HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
                 *other,round_direction round_dir)

{
  uint uVar1;
  uint uVar2;
  uint_type significand;
  uint uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  bool carried;
  bool local_29;
  
  (other->value_).data_ = 0;
  uVar1 = *(uint *)this;
  if ((uVar1 & 0x7fffffff) == 0) {
    if ((int)uVar1 < 0) {
      (other->value_).data_ = 0x8000;
    }
  }
  else {
    uVar5 = uVar1 & 0x7fffff;
    local_29 = false;
    significand = getRoundedNormalizedSignificand<spvutils::HexFloat<spvutils::FloatProxy<spvutils::Float16>,spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>>>>
                            (this,round_dir,&local_29);
    uVar2 = *(uint *)this;
    uVar3 = uVar2 >> 0x17 & 0xff;
    if (uVar3 == 0) {
      iVar4 = -0x7f;
      uVar3 = 0x400000;
      do {
        if ((uVar3 & uVar5) != 0) goto LAB_003dd5cf;
        iVar4 = iVar4 + -1;
        bVar6 = 1 < uVar3;
        uVar3 = uVar3 >> 1;
      } while (bVar6);
      iVar4 = -0x95;
    }
    else {
      iVar4 = uVar3 - 0x7f;
    }
LAB_003dd5cf:
    if (uVar5 == 0 || (uVar2 & 0x7f800000) != 0x7f800000) {
      if ((uVar5 == 0 && (uVar2 & 0x7f800000) == 0x7f800000) ||
         (0xf < (int)((uint)local_29 + iVar4))) {
        (other->value_).data_ = (ushort)(-1 < (int)uVar1) * -0x8000 - 0x400;
      }
      else {
        HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
        ::setFromSignUnbiasedExponentAndNormalizedSignificand
                  (other,SUB41(uVar1 >> 0x1f,0),(int_type)iVar4,significand,
                   (uVar2 >> 0x1f | kRoundToPositiveInfinity) == round_dir);
      }
    }
    else {
      (other->value_).data_ =
           (short)(uVar5 >> 0xd) + (ushort)(uVar5 >> 0xd == 0) | (ushort)(uVar1 >> 0x10) & 0x8000 |
           0x7c00;
    }
  }
  return;
}

Assistant:

void castTo(other_T& other, round_direction round_dir) {
    other = other_T(static_cast<typename other_T::native_type>(0));
    bool negate = isNegative();
    if (getUnsignedBits() == 0) {
      if (negate) {
        other.set_value(-other.value());
      }
      return;
    }
    uint_type significand = getSignificandBits();
    bool carried = false;
    typename other_T::uint_type rounded_significand =
        getRoundedNormalizedSignificand<other_T>(round_dir, &carried);

    int_type exponent = getUnbiasedExponent();
    if (exponent == min_exponent) {
      // If we are denormal, normalize the exponent, so that we can encode
      // easily.
      exponent = static_cast<int_type>(exponent + 1);
      for (uint_type check_bit = first_exponent_bit >> 1; check_bit != 0;
           check_bit = static_cast<uint_type>(check_bit >> 1)) {
        exponent = static_cast<int_type>(exponent - 1);
        if (check_bit & significand) break;
      }
    }

    bool is_nan =
        (getBits() & exponent_mask) == exponent_mask && significand != 0;
    bool is_inf =
        !is_nan &&
        ((exponent + carried) > static_cast<int_type>(other_T::exponent_bias) ||
         (significand == 0 && (getBits() & exponent_mask) == exponent_mask));

    // If we are Nan or Inf we should pass that through.
    if (is_inf) {
      other.set_value(BitwiseCast<typename other_T::underlying_type>(
          static_cast<typename other_T::uint_type>(
              (negate ? other_T::sign_mask : 0) | other_T::exponent_mask)));
      return;
    }
    if (is_nan) {
      typename other_T::uint_type shifted_significand;
      shifted_significand = static_cast<typename other_T::uint_type>(
          negatable_left_shift(
              static_cast<int_type>(other_T::num_fraction_bits) -
              static_cast<int_type>(num_fraction_bits), significand));

      // We are some sort of Nan. We try to keep the bit-pattern of the Nan
      // as close as possible. If we had to shift off bits so we are 0, then we
      // just set the last bit.
      other.set_value(BitwiseCast<typename other_T::underlying_type>(
          static_cast<typename other_T::uint_type>(
              (negate ? other_T::sign_mask : 0) | other_T::exponent_mask |
              (shifted_significand == 0 ? 0x1 : shifted_significand))));
      return;
    }

    bool round_underflow_up =
        isNegative() ? round_dir == kRoundToNegativeInfinity
                     : round_dir == kRoundToPositiveInfinity;
    typedef typename other_T::int_type other_int_type;
    // setFromSignUnbiasedExponentAndNormalizedSignificand will
    // zero out any underflowing value (but retain the sign).
    other.setFromSignUnbiasedExponentAndNormalizedSignificand(
        negate, static_cast<other_int_type>(exponent), rounded_significand,
        round_underflow_up);
    return;
  }